

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

int __thiscall IntegerType::fromBuffer(IntegerType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  
  uVar2 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
    uVar1 = (this->super_BER_CONTAINER)._length;
    uVar2 = (uVar1 & 0xffff) + uVar2;
    uVar4 = 0;
    for (lVar5 = 0; (short)uVar1 != (short)lVar5; lVar5 = lVar5 + 1) {
      uVar4 = uVar4 << 8 | (uint)buf[lVar5 + uVar3];
    }
    if (uVar1 == 3) {
      if ((uVar4 >> 0x17 & 1) != 0) {
        uVar4 = uVar4 | 0xff000000;
      }
    }
    else if (uVar1 == 2) {
      uVar4 = (int)(short)uVar4;
    }
    else if (uVar1 == 1) {
      uVar4 = (int)(char)uVar4;
    }
    this->_value = uVar4;
  }
  return uVar2;
}

Assistant:

int IntegerType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    unsigned short tempLength = _length;
    uint32_t tempVal = 0; 

    while(tempLength > 0){
        tempVal = tempVal << 8;
        tempVal = tempVal | *ptr++;
        tempLength--;
    }

    switch(_length){
        case 1:
            _value = (int8_t)tempVal;
        break;
        case 2:
            _value = (int16_t)tempVal;
        break;
        case 3:
            if(tempVal & 0x00800000){
                tempVal = tempVal |= 0xFF000000;
            }
            _value = (int32_t)tempVal;
        break;
        default:
            _value = (int32_t)tempVal;
    }
    
    return ptr - buf;
}